

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O1

int SM2_CTX_init(SM2_CTX *sm2_ctx,uint8_t *pubkey_x,uint8_t *pubkey_y)

{
  EC_GROUP *pEVar1;
  int iVar2;
  BN_CTX *ctx;
  BIGNUM *ret;
  BIGNUM *ret_00;
  EC_POINT *point;
  int iVar3;
  undefined1 auVar4 [16];
  
  if (sm2_ctx == (SM2_CTX *)0x0) {
    iVar3 = 0;
  }
  else {
    CRYPTO_crit_enter();
    sm2_ctx->pk_precomp = (void *)0x0;
    pEVar1 = sm2_group;
    sm2_ctx->group = sm2_group;
    if (pEVar1 == (EC_GROUP *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 1;
      if (pubkey_y != (uint8_t *)0x0 && pubkey_x != (uint8_t *)0x0) {
        ctx = (BN_CTX *)BN_CTX_new();
        ret = BN_new();
        ret_00 = BN_new();
        point = (EC_POINT *)EC_POINT_new((EC_GROUP *)sm2_ctx->group);
        auVar4._0_4_ = -(uint)((int)((ulong)ret >> 0x20) == 0 && (int)ret == 0);
        auVar4._4_4_ = -(uint)((int)ret_00 == 0 && (int)((ulong)ret_00 >> 0x20) == 0);
        auVar4._8_4_ = -(uint)((int)((ulong)ctx >> 0x20) == 0 && (int)ctx == 0);
        auVar4._12_4_ = -(uint)((int)point == 0 && (int)((ulong)point >> 0x20) == 0);
        iVar2 = movmskps((int)point,auVar4);
        iVar3 = 0;
        if (iVar2 == 0) {
          BN_bin2bn(pubkey_x,0x20,ret);
          BN_bin2bn(pubkey_y,0x20,ret_00);
          iVar2 = EC_POINT_set_affine_coordinates_GFp
                            ((EC_GROUP *)sm2_ctx->group,(EC_POINT *)point,ret,ret_00,(BN_CTX *)ctx);
          iVar3 = 0;
          if ((iVar2 != 0) &&
             (iVar2 = EC_GROUP_point_precompute_mult(sm2_ctx->group,&sm2_ctx->pk_precomp,point,ctx),
             iVar2 != 0)) {
            CRYPTO_memzero(sm2_ctx->sk_precomp,0x40);
            iVar3 = 1;
          }
        }
        BN_free(ret);
        BN_free(ret_00);
        BN_CTX_free((BN_CTX *)ctx);
        EC_POINT_free((EC_POINT *)point);
      }
    }
    CRYPTO_crit_leave();
  }
  return iVar3;
}

Assistant:

int SM2_CTX_init(SM2_CTX *sm2_ctx, uint8_t pubkey_x[32], uint8_t pubkey_y[32])
{
    int ret = GML_ERROR;
    BIGNUM *x = NULL;
    BIGNUM *y = NULL;
    BN_CTX *bn_ctx = NULL;
    EC_POINT *point = NULL;
    if (sm2_ctx == NULL)
        return GML_ERROR;

    CRYPTO_crit_enter();

    sm2_ctx->pk_precomp = NULL;
    sm2_ctx->group = (EC_GROUP*)SM2_get_group();
    if (sm2_ctx->group == NULL) {
        CRYPTO_crit_leave();
        return GML_ERROR;
    }

    /* no precompute */
    if (pubkey_x == NULL || pubkey_y == NULL) {
        CRYPTO_crit_leave();
        return GML_OK;
    }

    bn_ctx = BN_CTX_new();
    x = BN_new();
    y = BN_new();
    point = EC_POINT_new(sm2_ctx->group);
    if (x == NULL || y == NULL || bn_ctx == NULL || point == NULL)
        goto end;

    BN_bin2bn(pubkey_x, 32, x);
    BN_bin2bn(pubkey_y, 32, y);
    if (EC_POINT_set_affine_coordinates_GFp(sm2_ctx->group, point, x, y, bn_ctx) == GML_ERROR) {
        goto end;
    }

    /* compute precompute table for point */
    if (EC_GROUP_point_precompute_mult(sm2_ctx->group, &sm2_ctx->pk_precomp, point, bn_ctx) == GML_ERROR) {
        goto end;
    }

    CRYPTO_memzero(sm2_ctx->sk_precomp, 64);

    ret = GML_OK;
end:
    BN_free(x);
    BN_free(y);
    BN_CTX_free(bn_ctx);
    EC_POINT_free(point);
    CRYPTO_crit_leave();
    return ret;
}